

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::elemsStr<float_const*>
          (string *__return_storage_ptr__,Functional *this,float **begin,float **end,
          int wrapLengthParam,int numIndentationSpaces)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  ulong *puVar6;
  float *pfVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  string *result;
  string deepIndentation;
  string baseIndentation;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  int local_22c;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  float **local_200;
  Functional *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ulong local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_200 = begin;
  local_1f8 = this;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,'\0');
  paVar2 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)local_1a8,'\x04');
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)local_1a8,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_1f0.field_2._M_allocated_capacity = *psVar5;
    local_1f0.field_2._8_8_ = plVar3[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar5;
    local_1f0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_1f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_22c = 0x7fffffff;
  if (0 < (int)end) {
    local_22c = (int)end;
  }
  uVar11 = (ulong)((long)*local_200 - *(long *)local_1f8) >> 2;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar10 = (int)uVar11;
  if (local_22c < iVar10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x1c8849d);
    puVar6 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar6) {
      local_218 = *puVar6;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *puVar6;
      local_228 = (ulong *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
    puVar6 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar6) {
      local_260 = *puVar6;
      lStack_258 = plVar3[3];
      local_270 = &local_260;
    }
    else {
      local_260 = *puVar6;
      local_270 = (ulong *)*plVar3;
    }
    local_268 = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_270);
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
  }
  local_228 = &local_218;
  local_220 = 0;
  local_218 = local_218 & 0xffffffffffffff00;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_260 = *puVar6;
    lStack_258 = plVar3[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar6;
    local_270 = (ulong *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_22c < iVar10) {
    std::operator+(&local_250,"\n",&local_1f0);
  }
  else {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250," ","");
  }
  uVar8 = 0xf;
  if (local_270 != &local_260) {
    uVar8 = local_260;
  }
  if (uVar8 < local_250._M_string_length + local_268) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar9 = local_250.field_2._M_allocated_capacity;
    }
    if (local_250._M_string_length + local_268 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_270);
      goto LAB_0142e1f5;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
LAB_0142e1f5:
  psVar5 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_1a8[0].field_2._0_8_ = *psVar5;
    local_1a8[0].field_2._8_8_ = puVar4[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar5;
    local_1a8[0]._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_1a8[0]._M_string_length = puVar4[1];
  *puVar4 = psVar5;
  puVar4[1] = 0;
  *(undefined1 *)psVar5 = 0;
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)local_1a8[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_1b0 = uVar11;
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  local_208 = paVar1;
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  pfVar7 = *(float **)local_1f8;
  if (pfVar7 != *local_200) {
    iVar10 = 0;
    do {
      if (pfVar7 != *(float **)local_1f8) {
        local_228 = &local_218;
        local_220 = 0;
        local_218 = local_218 & 0xffffffffffffff00;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_260 = *puVar6;
          lStack_258 = plVar3[3];
          local_270 = &local_260;
        }
        else {
          local_260 = *puVar6;
          local_270 = (ulong *)*plVar3;
        }
        local_268 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (iVar10 % local_22c == 0) {
          std::operator+(&local_250,"\n",&local_1f0);
        }
        else {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,0x1b3c1e9);
        }
        uVar11 = 0xf;
        if (local_270 != &local_260) {
          uVar11 = local_260;
        }
        if (uVar11 < local_250._M_string_length + local_268) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar9 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_250._M_string_length + local_268) goto LAB_0142e406;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_270);
        }
        else {
LAB_0142e406:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
        }
        psVar5 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_1a8[0].field_2._0_8_ = *psVar5;
          local_1a8[0].field_2._8_8_ = puVar4[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar5;
          local_1a8[0]._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_1a8[0]._M_string_length = puVar4[1];
        *puVar4 = psVar5;
        puVar4[1] = 0;
        *(undefined1 *)psVar5 = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1a8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,local_218 + 1);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<double>((double)*pfVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_270);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      iVar10 = iVar10 + 1;
      pfVar7 = pfVar7 + 1;
    } while (pfVar7 != *local_200);
  }
  if (local_22c < (int)local_1b0) {
    std::operator+(local_1a8,"\n",&local_1d0);
  }
  else {
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8," ","");
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)local_1a8[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string elemsStr (const IterT& begin, const IterT& end, int wrapLengthParam = 0, int numIndentationSpaces = 0)
{
	const string	baseIndentation	= string(numIndentationSpaces, ' ');
	const string	deepIndentation	= baseIndentation + string(4, ' ');
	const int		wrapLength		= wrapLengthParam > 0 ? wrapLengthParam : std::numeric_limits<int>::max();
	const int		length			= (int)std::distance(begin, end);
	string			result;

	if (length > wrapLength)
		result += "(amount: " + de::toString(length) + ") ";
	result += string() + "{" + (length > wrapLength ? "\n"+deepIndentation : " ");

	{
		int index = 0;
		for (IterT it = begin; it != end; ++it)
		{
			if (it != begin)
				result += string() + ", " + (index % wrapLength == 0 ? "\n"+deepIndentation : "");
			result += de::toString(*it);
			index++;
		}

		result += length > wrapLength ? "\n"+baseIndentation : " ";
	}

	result += "}";
	return result;
}